

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_set_size(void *id,int newsize)

{
  uint uVar1;
  uint uVar2;
  array *paVar3;
  void *pvVar4;
  uint in_ESI;
  void *in_RDI;
  int numelem;
  int elemsize;
  array *newarray;
  array *oldarray;
  
  paVar3 = id_to_array(in_RDI);
  uVar2 = *(uint *)&paVar3->field_0x4 & 0xf;
  uVar1 = *(uint *)&paVar3->field_0x4;
  paVar3 = (array *)realloc(paVar3,(long)(int)in_ESI * (long)(int)uVar2 + 8);
  paVar3->size = in_ESI;
  *(uint *)&paVar3->field_0x4 = *(uint *)&paVar3->field_0x4 & 0xfffffff0 | uVar2;
  *(uint *)&paVar3->field_0x4 = *(uint *)&paVar3->field_0x4 & 0xf | uVar1 & 0xfffffff0;
  pvVar4 = prf_array_to_id(paVar3);
  return pvVar4;
}

Assistant:

void *
prf_array_set_size(void *id, int newsize)
{
  array *oldarray;
  array *newarray; 
  int elemsize;
  int numelem;

  oldarray = id_to_array(id);
  elemsize = oldarray->elemsize;
  numelem = oldarray->numelem;
  newarray = (array *)profit_realloc(oldarray,
                                     (size_t)newsize*elemsize + sizeof(array));
  
  newarray->size = newsize;
  newarray->elemsize = elemsize;
  newarray->numelem = numelem;
  
  return prf_array_to_id(newarray);
}